

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O2

void __thiscall
TPZCompElH1<pzshape::TPZShapeTetra>::SideShapeFunction
          (TPZCompElH1<pzshape::TPZShapeTetra> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  TPZManVector<int,_27> order;
  TPZManVector<long,_27> id;
  TPZManVector<int,_27> local_1b8;
  TPZManVector<long,_27> local_128;
  
  iVar1 = pztopology::TPZTetrahedron::NContainedSides(side);
  uVar2 = pztopology::TPZTetrahedron::NSideNodes(side);
  TPZManVector<long,_27>::TPZManVector(&local_128,(long)(int)uVar2);
  TPZManVector<int,_27>::TPZManVector(&local_1b8,(long)(int)(iVar1 - uVar2));
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  uVar6 = 0;
  uVar7 = 0;
  if (0 < (int)uVar2) {
    uVar7 = (ulong)uVar2;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    iVar3 = pztopology::TPZTetrahedron::SideNodeLocId(side,(int)uVar6);
    pTVar4 = TPZGeoEl::NodePtr(this_00,iVar3);
    local_128.super_TPZVec<long>.fStore[uVar6] = (long)pTVar4->fId;
  }
  for (lVar8 = 0; lVar8 + (int)uVar2 < (long)iVar1; lVar8 = lVar8 + 1) {
    iVar3 = pztopology::TPZTetrahedron::ContainedSideLocId(side,uVar2 + (int)lVar8);
    lVar5 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTetra>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,iVar3);
    local_1b8.super_TPZVec<int>.fStore[lVar8] = (uint)*(byte *)(lVar5 + 0x14);
  }
  pzshape::TPZShapeTetra::SideShape
            (side,point,&local_128.super_TPZVec<long>,&local_1b8.super_TPZVec<int>,phi,dphi);
  TPZManVector<int,_27>::~TPZManVector(&local_1b8);
  TPZManVector<long,_27>::~TPZManVector(&local_128);
  return;
}

Assistant:

void TPZCompElH1<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
	
	int nc = TSHAPE::NContainedSides(side);
	int nn = TSHAPE::NSideNodes(side);
	TPZManVector<int64_t,27> id(nn);
	TPZManVector<int,27> order(nc-nn);
	int n,c;
	TPZGeoEl *ref = this->Reference();
	for (n=0;n<nn;n++){
		int nodloc = TSHAPE::SideNodeLocId(side,n);
		id [n] = ref->NodePtr(nodloc)->Id();
	}
	for (c=nn;c<nc;c++){
		int conloc = TSHAPE::ContainedSideLocId(side,c);
        order[c-nn] = this->Connect(conloc).Order();
	}
	TSHAPE::SideShape(side, point, id, order, phi, dphi);
}